

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::CheckIfLoopIsHot(InterpreterStackFrame *this,uint profiledLoopCounter)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  int iVar2;
  FunctionBody *this_00;
  undefined4 extraout_var;
  char16 *pcVar3;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  
  this_00 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
  if (((this_00->field_0x179 & 0x40) == 0) && (DAT_01441dcc < profiledLoopCounter)) {
    sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_00);
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,JITLoopBodyPhase,sourceContextId,functionId);
    if (bVar1) {
      iVar2 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_00);
      pcVar3 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this_00,(wchar (*) [42])local_78);
      Output::Print(L"Speculate Jit set for this function with loopbody: function: %s (%s)\n",
                    CONCAT44(extraout_var,iVar2),pcVar3);
      Output::Flush();
    }
    FunctionBody::SetHasHotLoop(this_00);
  }
  return;
}

Assistant:

void
        InterpreterStackFrame::CheckIfLoopIsHot(uint profiledLoopCounter)
    {
        Js::FunctionBody *fn = this->function->GetFunctionBody();
        if (!fn->GetHasHotLoop() && profiledLoopCounter > (uint)CONFIG_FLAG(JitLoopBodyHotLoopThreshold))
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (PHASE_TRACE(Js::JITLoopBodyPhase, fn))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                Output::Print(
                    _u("Speculate Jit set for this function with loopbody: function: %s (%s)\n"),
                    fn->GetDisplayName(),
                    fn->GetDebugNumberSet(debugStringBuffer));
                Output::Flush();
            }
#endif
            fn->SetHasHotLoop();
        }
    }